

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall icu_63::DecimalFormat::setMultiplier(DecimalFormat *this,int32_t multiplier)

{
  DecimalFormatProperties *pDVar1;
  bool bVar2;
  int local_1c;
  int temp;
  int value;
  int delta;
  int32_t multiplier_local;
  DecimalFormat *this_local;
  
  value = multiplier;
  if (multiplier == 0) {
    value = 1;
  }
  temp = 0;
  local_1c = value;
  do {
    if (local_1c == 1) goto LAB_002cc8b8;
    temp = temp + 1;
    bVar2 = (local_1c / 10) * 10 == local_1c;
    local_1c = local_1c / 10;
  } while (bVar2);
  temp = -1;
LAB_002cc8b8:
  if (temp == -1) {
    pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    pDVar1->magnitudeMultiplier = 0;
    pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    pDVar1->multiplier = value;
  }
  else {
    pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    pDVar1->magnitudeMultiplier = temp;
    pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    pDVar1->multiplier = 1;
  }
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setMultiplier(int32_t multiplier) {
    if (multiplier == 0) {
        multiplier = 1;     // one being the benign default value for a multiplier.
    }

    // Try to convert to a magnitude multiplier first
    int delta = 0;
    int value = multiplier;
    while (value != 1) {
        delta++;
        int temp = value / 10;
        if (temp * 10 != value) {
            delta = -1;
            break;
        }
        value = temp;
    }
    if (delta != -1) {
        fields->properties->magnitudeMultiplier = delta;
        fields->properties->multiplier = 1;
    } else {
        fields->properties->magnitudeMultiplier = 0;
        fields->properties->multiplier = multiplier;
    }
    touchNoError();
}